

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Version.cpp
# Opt level: O1

void __thiscall csm::Version::Version(Version *this,string *version)

{
  iterator iVar1;
  long lVar2;
  Error *pEVar3;
  string v;
  ErrorType local_94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  (this->theVersions).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->theVersions).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->theVersions).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  lVar2 = std::__cxx11::string::find((char)version,0x2e);
  if (lVar2 != -1) {
    do {
      std::__cxx11::string::substr((ulong)&local_90,(ulong)version);
      lVar2 = std::__cxx11::string::find_first_not_of((char *)&local_90,0x11d94c,0);
      if (lVar2 != -1) {
        pEVar3 = (Error *)__cxa_allocate_exception(0x50);
        local_94 = INVALID_USE;
        std::operator+(&local_70,"Invalid version component: ",&local_90);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"csm::Version::Version","");
        Error::Error(pEVar3,&local_94,&local_70,&local_50);
        __cxa_throw(pEVar3,&Error::typeinfo,Error::~Error);
      }
      local_70._M_dataplus._M_p._0_4_ = atoi(local_90._M_dataplus._M_p);
      iVar1._M_current =
           (this->theVersions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->theVersions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&this->theVersions,iVar1,(int *)&local_70);
      }
      else {
        *iVar1._M_current = (int)local_70._M_dataplus._M_p;
        (this->theVersions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      lVar2 = std::__cxx11::string::find((char)version,0x2e);
    } while (lVar2 != -1);
  }
  std::__cxx11::string::substr((ulong)&local_90,(ulong)version);
  lVar2 = std::__cxx11::string::find_first_not_of((char *)&local_90,0x11d94c,0);
  if (lVar2 == -1) {
    local_70._M_dataplus._M_p._0_4_ = atoi(local_90._M_dataplus._M_p);
    iVar1._M_current =
         (this->theVersions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (this->theVersions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&this->theVersions,iVar1,(int *)&local_70);
    }
    else {
      *iVar1._M_current = (int)local_70._M_dataplus._M_p;
      (this->theVersions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  pEVar3 = (Error *)__cxa_allocate_exception(0x50);
  local_94 = INVALID_USE;
  std::operator+(&local_70,"Invalid version component: ",&local_90);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"csm::Version::Version","");
  Error::Error(pEVar3,&local_94,&local_70,&local_50);
  __cxa_throw(pEVar3,&Error::typeinfo,Error::~Error);
}

Assistant:

Version::Version(const std::string& version)
   :
      theVersions()
{
   static const char* const MODULE = "csm::Version::Version";

   // split on periods
   std::string::size_type pos = 0;
   std::string::size_type dotPos = 0;
   while ( (dotPos = version.find('.', pos)) != std::string::npos )
   {
      const std::string v = version.substr(pos, dotPos - pos);
      if (v.find_first_not_of("1234567890") != std::string::npos)
      {
         throw Error(Error::INVALID_USE, "Invalid version component: " + v,
                     MODULE);
      }

      theVersions.push_back(std::atoi(v.c_str()));
      pos = dotPos + 1;
   }

   // add the final version
   const std::string v = version.substr(pos);
   if (v.find_first_not_of("1234567890") != std::string::npos)
   {
      throw Error(Error::INVALID_USE, "Invalid version component: " + v,
                  MODULE);
   }
   theVersions.push_back(std::atoi(v.c_str()));
}